

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O3

value * __thiscall mpt::source<double>::value(source<double> *this)

{
  uint uVar1;
  ulong uVar2;
  double *pdVar3;
  
  uVar2 = this->_pos;
  if ((((-1 < (long)uVar2) && (uVar2 < (this->super_span<const_double>)._len >> 3)) &&
      (pdVar3 = (this->super_span<const_double>)._base, pdVar3 != (double *)0x0)) &&
     (uVar1 = this->_type, uVar1 - 1 < 0xfff)) {
    (this->_val)._addr = pdVar3 + uVar2;
    (this->_val)._type = (ulong)uVar1;
    return &this->_val;
  }
  return (value *)0x0;
}

Assistant:

const struct value *value() __MPT_OVERRIDE
	{
		const T *val;
		if (_pos < 0 || !(val = span<const T>::nth(_pos))) {
			return 0;
		}
		return _val.set(_type, val) ? &_val : 0;
	}